

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.cpp
# Opt level: O2

NodeRecordMB * __thiscall
embree::sse2::BVHNBuilderMblurVirtual<4>::BVHNBuilderV::build
          (NodeRecordMB *__return_storage_ptr__,BVHNBuilderV *this,FastAllocator *allocator,
          BuildProgressMonitor *progressFunc,PrimRef *prims,PrimInfo *pinfo,Settings settings,
          BBox1f *timeRange)

{
  BVHNBuilderV *local_10;
  
  local_10 = this;
  BVHBuilderBinnedSAH::
  build<embree::BVHNodeRecordMB<embree::NodeRefPtr<4>>,embree::FastAllocator::Create,embree::AABBNodeMB_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB_t<embree::NodeRefPtr<4>,4>::SetTimeRange,embree::sse2::BVHNBuilderMblurVirtual<4>::BVHNBuilderV::build(embree::FastAllocator*,embree::BuildProgressMonitor&,embree::PrimRef*,embree::PrimInfoT<embree::BBox<embree::Vec3fa>>const&,embree::sse2::GeneralBVHBuilder::Settings,embree::BBox<float>const&)::_lambda(embree::PrimRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::BuildProgressMonitor>
            (*timeRange,(BVHBuilderBinnedSAH *)__return_storage_ptr__,allocator,&local_10);
  return __return_storage_ptr__;
}

Assistant:

typename BVHN<N>::NodeRecordMB BVHNBuilderMblurVirtual<N>::BVHNBuilderV::build(FastAllocator* allocator, BuildProgressMonitor& progressFunc, PrimRef* prims, const PrimInfo& pinfo, GeneralBVHBuilder::Settings settings, const BBox1f& timeRange)
    {
      auto createLeafFunc = [&] (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) -> NodeRecordMB {
        return createLeaf(prims,set,alloc);
      };

      settings.branchingFactor = N;
      settings.maxDepth = BVH::maxBuildDepthLeaf;
      return BVHBuilderBinnedSAH::build<NodeRecordMB>
        (FastAllocator::Create(allocator),typename BVH::AABBNodeMB::Create(),typename BVH::AABBNodeMB::SetTimeRange(timeRange),createLeafFunc,progressFunc,prims,pinfo,settings);
    }